

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O2

QImage * __thiscall
QFontEngineFT::alphaMapForGlyph
          (QImage *__return_storage_ptr__,QFontEngineFT *this,glyph_t g,
          QFixedPoint *subPixelPosition,QTransform *t)

{
  QColor color;
  TransformationType TVar1;
  Glyph *glyph;
  bool bVar2;
  GlyphFormat format;
  long in_FS_OFFSET;
  QImage local_60;
  undefined4 local_48;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined6 uStack_40;
  ushort uStack_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->freetype->face->face_flags & 1) == 0) {
    TVar1 = QTransform::type(t);
    bVar2 = 1 < (int)TVar1;
  }
  else {
    bVar2 = false;
  }
  local_48 = 0;
  uStack_44 = 0xffff;
  format = (byte)(this->antialias | bVar2) + Format_Mono;
  uStack_42 = 0;
  uStack_40 = 0;
  color._8_8_ = (ulong)uStack_3a << 0x30;
  color._0_8_ = 0xffff00000000;
  glyph = loadGlyphFor(this,g,subPixelPosition,format,t,color,false,true);
  (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  alphaMapFromGlyphData(__return_storage_ptr__,glyph,format);
  if (bVar2 == false) {
    QImage::copy(&local_60,(QRect *)__return_storage_ptr__);
    QImage::operator=(__return_storage_ptr__,&local_60);
  }
  else {
    QImage::transformed(&local_60,__return_storage_ptr__,t,FastTransformation);
    QImage::operator=(__return_storage_ptr__,&local_60);
  }
  QImage::~QImage(&local_60);
  if ((glyph != &emptyGlyph) && (this->cacheEnabled == false)) {
    if (glyph != (Glyph *)0x0) {
      QFontEngine::Glyph::~Glyph(glyph);
    }
    operator_delete(glyph,0x18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QImage QFontEngineFT::alphaMapForGlyph(glyph_t g,
                                       const QFixedPoint &subPixelPosition,
                                       const QTransform &t)
{
    const bool needsImageTransform = !FT_IS_SCALABLE(freetype->face)
            && t.type() > QTransform::TxTranslate;
    const GlyphFormat neededFormat = antialias || needsImageTransform ? Format_A8 : Format_Mono;

    Glyph *glyph = loadGlyphFor(g, subPixelPosition, neededFormat, t, QColor(), false, true);

    QImage img = alphaMapFromGlyphData(glyph, neededFormat);
    if (needsImageTransform)
        img = img.transformed(t, Qt::FastTransformation);
    else
        img = img.copy();

    if (!cacheEnabled && glyph != &emptyGlyph)
        delete glyph;

    return img;
}